

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cpp
# Opt level: O2

string * __thiscall
spvtools::GetExtensionString_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,spv_parsed_instruction_t *inst)

{
  uint __line;
  char *__assertion;
  allocator<char> local_9;
  
  if (*(short *)(this + 10) != 10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ERROR_not_op_extension",&local_9);
    return __return_storage_ptr__;
  }
  if (*(short *)(this + 0x20) == 1) {
    if (*(int *)(*(ushort **)(this + 0x18) + 2) == 0xb) {
      if (**(ushort **)(this + 0x18) < *(ushort *)(this + 8)) {
        spvDecodeLiteralStringOperand_abi_cxx11_
                  (__return_storage_ptr__,(spv_parsed_instruction_t *)this,0);
        return __return_storage_ptr__;
      }
      __assertion = "inst->num_words > operand.offset";
      __line = 0x23;
    }
    else {
      __assertion = "operand.type == SPV_OPERAND_TYPE_LITERAL_STRING";
      __line = 0x22;
    }
  }
  else {
    __assertion = "inst->num_operands == 1";
    __line = 0x1f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/extensions.cpp"
                ,__line,"std::string spvtools::GetExtensionString(const spv_parsed_instruction_t *)"
               );
}

Assistant:

std::string GetExtensionString(const spv_parsed_instruction_t* inst) {
  if (inst->opcode != static_cast<uint16_t>(spv::Op::OpExtension)) {
    return "ERROR_not_op_extension";
  }

  assert(inst->num_operands == 1);

  const auto& operand = inst->operands[0];
  assert(operand.type == SPV_OPERAND_TYPE_LITERAL_STRING);
  assert(inst->num_words > operand.offset);
  (void)operand; /* No unused variables in release builds. */

  return spvDecodeLiteralStringOperand(*inst, 0);
}